

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
::AddUnbridgedToBackend
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
           *this,BasicFlatModelAPI *be,ItemNamer *vnam)

{
  ExpressionAcceptanceLevel EVar1;
  
  EVar1 = BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR(&this->super_BasicConstraintKeeper);
  if ((EVar1 == NotAccepted) ||
     ((this->cvt_->
      super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ).
      super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      .options_.accExpr_ != 1)) {
    AddAllUnbridged(this,be,vnam);
  }
  return;
}

Assistant:

void AddUnbridgedToBackend(
      BasicFlatModelAPI& be,
      ItemNamer& vnam) override {
    if (ExpressionAcceptanceLevel::NotAccepted
        == GetChosenAcceptanceLevelEXPR()
        || !GetConverter().IfWantNLOutput()) {
      try {
        AddAllUnbridged(be, vnam);
      } catch (const std::exception& exc) {
        MP_RAISE(std::string("Adding constraint of type '") +
                 Constraint::GetTypeName() + "' to " +
                 Backend::GetTypeName() + std::string(": ") +
                 exc.what());
      }
    }
  }